

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O3

void as197(double *inp,int N,int optmethod,int p,int d,int q,double *phi,double *theta,double *wmean
          ,double *var,double *resid,double *loglik,double *hess)

{
  size_t __size;
  double dVar1;
  int N_00;
  uint uVar2;
  double *oup;
  alik_object __ptr;
  double *xi;
  double *xf;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  void *pvVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined1 local_90 [8];
  custom_function as197_min;
  
  pvVar7 = (void *)(ulong)(uint)d;
  uVar5 = (ulong)(uint)N;
  oup = (double *)malloc((long)(N - d) << 3);
  __ptr = alik_init(p,d,q,N);
  css(inp,N,optmethod,p,d,q,phi,theta,wmean,var,resid,loglik,hess);
  as197_min.params = pvVar7;
  if (d < 1) {
    if (0 < N) {
      memcpy(oup,inp,uVar5 << 3);
    }
  }
  else {
    uVar2 = diff(inp,N,d,oup);
    uVar5 = (ulong)uVar2;
  }
  iVar4 = (int)uVar5;
  __ptr->N = iVar4;
  dVar1 = *wmean;
  __ptr->mean = dVar1;
  N_00 = __ptr->pq;
  __size = (long)N_00 * 8;
  xi = (double *)malloc(__size);
  xf = (double *)malloc(__size);
  if (0 < p) {
    memcpy(xi,phi,(ulong)(uint)p * 8);
  }
  if (0 < q) {
    uVar3 = 0;
    do {
      xi[(long)p + uVar3] = -theta[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)q != uVar3);
  }
  if (__ptr->M == 1) {
    xi[q + p] = dVar1;
  }
  if (0 < iVar4) {
    uVar3 = 0;
    do {
      dVar1 = oup[uVar3];
      __ptr->x[(uint)(iVar4 * 2) + uVar3] = dVar1;
      __ptr->x[uVar3] = dVar1;
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (iVar4 < iVar4 * 2) {
    memset(__ptr->x + iVar4,0,(ulong)(iVar4 - 1) * 8 + 8);
  }
  local_90 = (undefined1  [8])fas197;
  as197_min.funcpt = (_func_double_double_ptr_int_void_ptr *)__ptr;
  fminunc((custom_function *)local_90,(custom_gradient *)0x0,N_00,xi,1.0,optmethod,xf);
  if (0 < N_00) {
    lVar6 = 0;
    do {
      printf("%g ",SUB84(xf[lVar6],0));
      lVar6 = lVar6 + 1;
    } while (N_00 != lVar6);
  }
  if (0 < p) {
    memcpy(phi,xf,(ulong)(uint)p << 3);
  }
  pvVar7 = as197_min.params;
  if (0 < q) {
    memcpy(theta,xf + p,(ulong)(uint)q << 3);
  }
  uVar8 = 0;
  uVar9 = 0;
  if (__ptr->M == 1) {
    uVar8 = SUB84(xf[q + p],0);
    uVar9 = (undefined4)((ulong)xf[q + p] >> 0x20);
  }
  *wmean = (double)CONCAT44(uVar9,uVar8);
  if ((int)(uint)pvVar7 < iVar4) {
    memcpy(resid,__ptr->x + iVar4,(ulong)(~(uint)pvVar7 + iVar4) * 8 + 8);
  }
  *var = __ptr->ssq / (double)iVar4;
  free(xi);
  free(xf);
  free(oup);
  free(__ptr);
  return;
}

Assistant:

void as197(double *inp, int N, int optmethod, int p, int d, int q, double *phi, double *theta, double *wmean, double *var,double *resid,double *loglik,double *hess) {
	int i, pq, retval, length;
	double *b, *tf, *x;
	double maxstep;
	alik_object obj;
	//custom_function as154_min;

	x = (double*)malloc(sizeof(double)* (N - d));

	length = N;

	maxstep = 1.0;

	obj = alik_init(p, d, q, N);


	css(inp, N, optmethod, p, d, q, phi, theta, wmean, var,resid,loglik,hess);

	if (d > 0) {
		N = diff(inp, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp[i];
		}
	}

	obj->N = N;
	obj->mean = *wmean;
	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);

	for (i = 0; i < p; ++i) {
		b[i] = phi[i];
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = -theta[i];
	}

	if (obj->M == 1) {
		b[p + q] = obj->mean;
	}

	//mdisplay(b, 1, pq);

	for (i = 0; i < N; ++i) {
		obj->x[i] = obj->x[2 * N + i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[i] = 0.0;
	}

	custom_function as197_min = { fas197, obj };
	retval = fminunc(&as197_min, NULL, pq, b, maxstep, optmethod, tf);

	for (i = 0; i < pq; ++i) {
		printf("%g ", tf[i]);
	}

	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = tf[p + i];
	}
	if (obj->M == 1) {
		*wmean = tf[p + q];
	}
	else {
		*wmean = 0.0;
	}
	for (i = 0; i < N - d; ++i) {
		resid[i] = obj->x[N + i];
	}
	*var = (obj->ssq) / (double)N;


	free(b);
	free(tf);
	free(x);
	free_alik(obj);
}